

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_types.cpp
# Opt level: O0

UniValue * BanMapToJson(banmap_t *bans)

{
  bool bVar1;
  UniValue *this;
  CSubNet *in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  CBanEntry *ban_entry;
  CSubNet *address;
  pair<const_CSubNet,_CBanEntry> *it;
  banmap_t *__range1;
  UniValue *bans_json;
  const_iterator __end1;
  const_iterator __begin1;
  UniValue j;
  UniValue *in_stack_fffffffffffffdf8;
  UniValue *in_stack_fffffffffffffe00;
  UniValue *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  UniValue *this_00;
  UniValue *val;
  UniValue *this_01;
  CBanEntry *in_stack_fffffffffffffe50;
  undefined1 local_181 [9];
  _Base_ptr local_178;
  UniValue local_170 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(in_stack_fffffffffffffe10);
  UniValue::UniValue(in_RDI,(VType)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                     (string *)in_stack_fffffffffffffe08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdf8);
  local_178 = (_Base_ptr)
              std::
              map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
              ::begin((map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
                       *)in_stack_fffffffffffffe00);
  local_181._1_8_ =
       std::
       map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
       ::end((map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
              *)in_stack_fffffffffffffe00);
  while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffe08,
                                 (_Self *)in_stack_fffffffffffffe00), ((bVar1 ^ 0xffU) & 1) != 0) {
    this = (UniValue *)
           std::_Rb_tree_const_iterator<std::pair<const_CSubNet,_CBanEntry>_>::operator*
                     ((_Rb_tree_const_iterator<std::pair<const_CSubNet,_CBanEntry>_> *)
                      in_stack_fffffffffffffdf8);
    val = (UniValue *)
          &(this->keys).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    this_01 = this;
    CBanEntry::ToJson(in_stack_fffffffffffffe50);
    this_00 = (UniValue *)local_181;
    in_stack_fffffffffffffe08 = (UniValue *)BANMAN_JSON_ADDR_KEY;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
               (char *)this_01,(allocator<char> *)this);
    CSubNet::ToString_abi_cxx11_(in_RSI);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
    UniValue::pushKV(this_01,(string *)this,val);
    UniValue::~UniValue(in_stack_fffffffffffffdf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdf8);
    std::allocator<char>::~allocator((allocator<char> *)local_181);
    in_stack_fffffffffffffe00 = local_170;
    UniValue::UniValue(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    UniValue::push_back(this_00,in_stack_fffffffffffffe08);
    UniValue::~UniValue(in_stack_fffffffffffffdf8);
    UniValue::~UniValue(in_stack_fffffffffffffdf8);
    std::_Rb_tree_const_iterator<std::pair<const_CSubNet,_CBanEntry>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_CSubNet,_CBanEntry>_> *)
               in_stack_fffffffffffffdf8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

UniValue BanMapToJson(const banmap_t& bans)
{
    UniValue bans_json(UniValue::VARR);
    for (const auto& it : bans) {
        const auto& address = it.first;
        const auto& ban_entry = it.second;
        UniValue j = ban_entry.ToJson();
        j.pushKV(BANMAN_JSON_ADDR_KEY, address.ToString());
        bans_json.push_back(std::move(j));
    }
    return bans_json;
}